

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O2

RCOError __thiscall RCO::getIdStringString(RCO *this,string *s,uint32_t offset,bool loopback)

{
  undefined1 auStack_118 [240];
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  memcpy(auStack_118,this->mBuffer + (ulong)offset + (ulong)(this->mHeader).id_str_start_off + 4,
         0xff);
  std::__cxx11::string::assign((char *)s);
  return NO_ERROR;
}

Assistant:

RCOError RCO::getIdStringString(std::string& s, uint32_t offset, bool loopback = false)
{
	char buf[256];
	uint32_t loopback_val;

	memcpy(&loopback_val, mBuffer + mHeader.id_str_start_off + offset, sizeof(uint32_t));
	memset(buf, 0, 256);
	memcpy(buf, mBuffer + mHeader.id_str_start_off + offset + sizeof(uint32_t), 255 * sizeof(char));

	s = buf;
	return NO_ERROR;
}